

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int stbi_write_tga_core(stbi__write_context *s,int x,int y,int comp,void *data)

{
  stbi__write_context *psVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  uint uVar8;
  void *__s1;
  uchar *d;
  int iVar9;
  long lVar10;
  size_t __n;
  long lVar11;
  bool bVar12;
  uchar header_1;
  uchar header;
  ulong local_b0;
  long local_a8;
  ulong local_a0;
  ulong local_98;
  int local_8c;
  int local_88;
  int local_84;
  void *local_80;
  long local_78;
  stbi__write_context *local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  long local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  uVar5 = (ulong)(uint)comp;
  uVar6 = (ulong)(uint)x;
  bVar12 = (comp - 2U & 0xfffffffd) == 0;
  uVar3 = (uint)bVar12;
  iVar9 = comp - uVar3;
  if ((y | x) < 0) {
    iVar9 = 0;
  }
  else {
    uVar8 = iVar9 < 2 | 2;
    local_80 = data;
    if (stbi_write_tga_with_rle == 0) {
      iVar9 = stbiw__outfile(s,uVar8,0,x,y,comp,0,data,(uint)bVar12,0,"111 221 2222 11",0,0,
                             (ulong)uVar8,0,0,0,0,0,uVar6,(ulong)(uint)y,
                             (ulong)((iVar9 + uVar3) * 8),(ulong)((uint)bVar12 * 8));
    }
    else {
      uVar8 = iVar9 < 2 | 10;
      d = (uchar *)0x0;
      stbiw__writef(s,(char *)(ulong)uVar8,0,0,(ulong)uVar8,0,0,0,0,0,uVar6,(ulong)(uint)y,
                    (ulong)((iVar9 + uVar3) * 8),(ulong)((uint)bVar12 * 8));
      uVar3 = y - 1;
      if (stbi__flip_vertically_on_write != 0) {
        uVar3 = 0;
      }
      uVar8 = -(uint)(stbi__flip_vertically_on_write == 0) | y;
      local_48 = (ulong)uVar8;
      iVar9 = 1;
      if (uVar3 != uVar8) {
        local_50 = 1;
        if (stbi__flip_vertically_on_write == 0) {
          local_50 = 0xffffffff;
        }
        local_8c = comp * x;
        local_84 = x + -1;
        __n = (size_t)comp;
        lVar10 = (long)x;
        local_b0 = (ulong)uVar3;
        iVar9 = uVar3 * local_8c;
        local_88 = (int)local_50 * local_8c;
        local_a0 = uVar5;
        local_70 = s;
        local_68 = uVar6;
        local_60 = (ulong)bVar12;
        local_58 = lVar10;
        do {
          local_78 = (long)iVar9;
          if (0 < (int)uVar6) {
            local_40 = (long)(local_8c * (int)local_b0) + (long)local_80;
            local_a8 = (long)local_80 + local_78;
            local_38 = 0;
            do {
              iVar9 = (int)local_38;
              lVar11 = (long)(iVar9 * (int)uVar5);
              uVar4 = 1;
              if (iVar9 < local_84) {
                __s1 = (void *)(local_40 + lVar11);
                iVar2 = bcmp(__s1,(void *)((iVar9 + 1) * (int)local_a0 + local_40),__n);
                iVar9 = iVar9 + 2;
                if (iVar2 != 0) {
                  uVar4 = 2;
                  if (iVar9 < (int)uVar6) {
                    lVar10 = (long)iVar9;
                    pvVar7 = (void *)(__n * lVar10 + local_a8);
                    uVar4 = 1;
                    do {
                      lVar10 = lVar10 + 1;
                      iVar9 = bcmp(__s1,pvVar7,__n);
                      if (iVar9 == 0) goto LAB_00161f5d;
                      iVar9 = (int)uVar4;
                      uVar3 = iVar9 + 1;
                      uVar4 = (ulong)uVar3;
                      if (local_58 <= lVar10) break;
                      __s1 = (void *)((long)__s1 + __n);
                      pvVar7 = (void *)((long)pvVar7 + __n);
                    } while (uVar3 < 0x7f);
                    uVar4 = (ulong)(iVar9 + 2);
                  }
                  goto LAB_00161f5d;
                }
                uVar5 = 2;
                if (iVar9 < (int)uVar6) {
                  lVar11 = (long)iVar9;
                  pvVar7 = (void *)(__n * lVar11 + local_a8);
                  uVar3 = 2;
                  while( true ) {
                    lVar11 = lVar11 + 1;
                    iVar9 = bcmp(__s1,pvVar7,__n);
                    if (iVar9 != 0) break;
                    uVar5 = (ulong)(uVar3 + 1);
                    if ((lVar10 <= lVar11) ||
                       (pvVar7 = (void *)((long)pvVar7 + __n), bVar12 = 0x7e < uVar3,
                       uVar3 = uVar3 + 1, bVar12)) goto LAB_00161fdb;
                  }
                  uVar5 = (ulong)uVar3;
                }
LAB_00161fdb:
                psVar1 = local_70;
                header_1 = (char)uVar5 + '\x7f';
                local_98 = uVar5;
                (*local_70->func)(local_70->context,&header_1,1);
                uVar5 = local_a0;
                stbiw__write_pixel(psVar1,(int)local_a0,(int)local_60,0,(int)__s1,d);
              }
              else {
LAB_00161f5d:
                psVar1 = local_70;
                header = (char)uVar4 + 0xff;
                (*local_70->func)(local_70->context,&header,1);
                uVar6 = local_60;
                uVar5 = local_a0;
                lVar10 = local_58;
                local_98 = uVar4;
                if (0 < (int)uVar4) {
                  lVar11 = lVar11 + local_a8;
                  do {
                    stbiw__write_pixel(psVar1,(int)uVar5,(int)uVar6,0,(int)lVar11,d);
                    lVar11 = lVar11 + __n;
                    uVar4 = uVar4 - 1;
                    lVar10 = local_58;
                  } while (uVar4 != 0);
                }
              }
              uVar3 = (int)local_98 + (int)local_38;
              local_38 = (ulong)uVar3;
              uVar6 = local_68;
            } while ((int)uVar3 < (int)local_68);
          }
          local_b0 = local_b0 + local_50;
          iVar9 = (int)local_78 + local_88;
        } while ((int)local_48 != (int)local_b0);
        iVar9 = 1;
      }
    }
  }
  return iVar9;
}

Assistant:

static int stbi_write_tga_core(stbi__write_context *s, int x, int y, int comp, void *data)
{
   int has_alpha = (comp == 2 || comp == 4);
   int colorbytes = has_alpha ? comp-1 : comp;
   int format = colorbytes < 2 ? 3 : 2; // 3 color channels (RGB/RGBA) = 2, 1 color channel (Y/YA) = 3

   if (y < 0 || x < 0)
      return 0;

   if (!stbi_write_tga_with_rle) {
      return stbiw__outfile(s, -1, -1, x, y, comp, 0, (void *) data, has_alpha, 0,
         "111 221 2222 11", 0, 0, format, 0, 0, 0, 0, 0, x, y, (colorbytes + has_alpha) * 8, has_alpha * 8);
   } else {
      int i,j,k;
      int jend, jdir;

      stbiw__writef(s, "111 221 2222 11", 0,0,format+8, 0,0,0, 0,0,x,y, (colorbytes + has_alpha) * 8, has_alpha * 8);

      if (stbi__flip_vertically_on_write) {
         j = 0;
         jend = y;
         jdir = 1;
      } else {
         j = y-1;
         jend = -1;
         jdir = -1;
      }
      for (; j != jend; j += jdir) {
         unsigned char *row = (unsigned char *) data + j * x * comp;
         int len;

         for (i = 0; i < x; i += len) {
            unsigned char *begin = row + i * comp;
            int diff = 1;
            len = 1;

            if (i < x - 1) {
               ++len;
               diff = memcmp(begin, row + (i + 1) * comp, comp);
               if (diff) {
                  const unsigned char *prev = begin;
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (memcmp(prev, row + k * comp, comp)) {
                        prev += comp;
                        ++len;
                     } else {
                        --len;
                        break;
                     }
                  }
               } else {
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (!memcmp(begin, row + k * comp, comp)) {
                        ++len;
                     } else {
                        break;
                     }
                  }
               }
            }

            if (diff) {
               unsigned char header = STBIW_UCHAR(len - 1);
               s->func(s->context, &header, 1);
               for (k = 0; k < len; ++k) {
                  stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin + k * comp);
               }
            } else {
               unsigned char header = STBIW_UCHAR(len - 129);
               s->func(s->context, &header, 1);
               stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin);
            }
         }
      }
   }
   return 1;
}